

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O3

int mraa_find_i2c_bus_pci(char *pci_device,char *pci_id,char *adapter_name)

{
  ulong uVar1;
  mraa_boolean_t mVar2;
  uint uVar3;
  mraa_result_t mVar4;
  char *__ptr;
  byte *pbVar5;
  char *intStr;
  int iVar6;
  ulong uVar7;
  char delim;
  dirent **namelist;
  int ret;
  char *dup;
  char path [1024];
  char local_459;
  dirent **local_458;
  uint local_44c;
  char *local_448;
  char *local_440;
  char local_438 [1032];
  
  snprintf(local_438,0x3ff,"/sys/devices/pci%s/%s/%s/",pci_device,pci_id,adapter_name);
  mVar2 = mraa_file_exist(local_438);
  if (mVar2 != 0) {
    uVar3 = scandir(local_438,&local_458,(__selector *)0x0,alphasort);
    if ((int)uVar3 < 0) {
      syslog(3,"Failed to get information on i2c");
    }
    else {
      local_448 = adapter_name;
      if (uVar3 != 0) {
        uVar7 = (ulong)uVar3;
        do {
          __ptr = strdup(local_458[uVar7 - 1]->d_name);
          local_440 = __ptr;
          if (__ptr == (char *)0x0) {
            syslog(3,"Ran out of memory!");
            break;
          }
          local_459 = '-';
          pbVar5 = (byte *)strsep(&local_440,&local_459);
          if (pbVar5 != (byte *)0x0) {
            iVar6 = *pbVar5 - 0x69;
            if ((iVar6 == 0) && (iVar6 = pbVar5[1] - 0x32, iVar6 == 0)) {
              iVar6 = 99 - (uint)pbVar5[2];
            }
            else {
              iVar6 = -iVar6;
            }
            if ((iVar6 == 0) && (intStr = strsep(&local_440,&local_459), intStr != (char *)0x0)) {
              local_44c = 0xffffffff;
              mVar4 = mraa_atoi(intStr,(int *)&local_44c);
              free(__ptr);
              free(local_458[uVar7 - 1]);
              free(local_458);
              uVar3 = local_44c;
              if (mVar4 != MRAA_SUCCESS) {
                return -1;
              }
              syslog(5,"Adding i2c bus found on i2c-%d on adapter %s",(ulong)local_44c,local_448);
              return uVar3;
            }
          }
          uVar1 = uVar7 - 1;
          free(__ptr);
          free(local_458[uVar7 - 1]);
          uVar7 = uVar1;
        } while (uVar1 != 0);
      }
      free(local_458);
    }
  }
  return -1;
}

Assistant:

int
mraa_find_i2c_bus_pci(const char* pci_device, const char* pci_id, const char* adapter_name)
{
    /**
     * For example we'd get something like:
     * pci0000:00/0000:00:16.3/i2c_desiignware.3
     */
    char path[1024];
    snprintf(path, 1024 - 1, "/sys/devices/pci%s/%s/%s/", pci_device, pci_id, adapter_name);
    if (mraa_file_exist(path)) {
        struct dirent** namelist;
        int n;
        n = scandir(path, &namelist, NULL, alphasort);
        if (n < 0) {
            syslog(LOG_ERR, "Failed to get information on i2c");
            return -1;
        } else {
            while (n--) {
                char* dup = strdup(namelist[n]->d_name);
                char* orig_dup = dup;
                if (dup == NULL) {
                    syslog(LOG_ERR, "Ran out of memory!");
                    break;
                }
                const char delim = '-';
                char* token;
                token = strsep(&dup, &delim);
                if (token != NULL) {
                    if (strncmp("i2c", token, 3) == 0) {
                        token = strsep(&dup, &delim);
                        if (token != NULL) {
                            int ret = -1;
                            if (mraa_atoi(token, &ret) == MRAA_SUCCESS) {
                                free(orig_dup);
                                free(namelist[n]);
                                free(namelist);
                                syslog(LOG_NOTICE, "Adding i2c bus found on i2c-%d on adapter %s", ret, adapter_name);
                                return ret;
                            }
                            free(orig_dup);
                            free(namelist[n]);
                            free(namelist);
                            return -1;
                        }
                    }
                }
                free(orig_dup);
                free(namelist[n]);
            }
            free(namelist);
        }
    }
    return -1;
}